

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

uint8_t __thiscall
libtorrent::aux::session_impl::use_quota_overhead
          (session_impl *this,peer_class_set *set,int amount_down,int amount_up)

{
  byte bVar1;
  bool bVar2;
  peer_class *ch;
  ulong uVar3;
  session_impl *this_00;
  byte bVar4;
  byte bVar5;
  
  uVar3 = 0;
  bVar1 = (byte)*(undefined4 *)set;
  if ((char)bVar1 < '\x01') {
    bVar1 = 0;
  }
  bVar4 = 0;
  for (; bVar1 != uVar3; uVar3 = uVar3 + 1) {
    this_00 = (session_impl *)&this->m_classes;
    ch = peer_class_pool::at(&this->m_classes,
                             (peer_class_t)
                             (set->m_class).
                             super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
                             ._M_elems[uVar3].m_val);
    if (ch != (peer_class *)0x0) {
      bVar2 = use_quota_overhead(this_00,(bandwidth_channel *)&ch->field_0x18,amount_down);
      bVar5 = bVar4 | 2;
      if (!bVar2) {
        bVar5 = bVar4;
      }
      bVar2 = use_quota_overhead(this_00,(bandwidth_channel *)ch,amount_up);
      bVar4 = bVar2 | bVar5;
    }
  }
  return bVar4;
}

Assistant:

std::uint8_t session_impl::use_quota_overhead(peer_class_set& set, int const amount_down, int const amount_up)
	{
		std::uint8_t ret = 0;
		int const num = set.num_classes();
		for (int i = 0; i < num; ++i)
		{
			peer_class* p = m_classes.at(set.class_at(i));
			if (p == nullptr) continue;

			bandwidth_channel* ch = &p->channel[peer_connection::download_channel];
			if (use_quota_overhead(ch, amount_down))
				ret |= 1u << peer_connection::download_channel;
			ch = &p->channel[peer_connection::upload_channel];
			if (use_quota_overhead(ch, amount_up))
				ret |= 1u << peer_connection::upload_channel;
		}
		return ret;
	}